

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void smult(double *A,double *B,double *C,int m,int n,int p)

{
  double *Y_00;
  double *Y_01;
  double *C_00;
  void *__ptr;
  double *P;
  double *Z;
  double *Y;
  double *X;
  int local_38;
  int nrec;
  int c;
  int b;
  int a;
  int p_local;
  int n_local;
  int m_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  local_38 = p;
  nrec = n;
  c = m;
  b = p;
  a = n;
  p_local = m;
  _n_local = C;
  C_local = B;
  B_local = A;
  findrec(&c,&nrec,&local_38);
  Y_00 = (double *)malloc((long)c * 8 * (long)nrec);
  Y_01 = (double *)malloc((long)nrec * 8 * (long)local_38);
  C_00 = (double *)malloc((long)c * 8 * (long)local_38);
  __ptr = malloc((long)(c / 2) * 8 * (long)(local_38 / 2));
  add_zero_pad(B_local,p_local,a,c - p_local,nrec - a,Y_00);
  add_zero_pad(C_local,a,b,nrec - a,local_38 - b,Y_01);
  srecmult(Y_00,Y_01,C_00,c,nrec,local_38,nrec,local_38,local_38);
  remove_zero_pad(C_00,c,local_38,c - p_local,local_38 - b,_n_local);
  free(Y_00);
  free(Y_01);
  free(C_00);
  free(__ptr);
  return;
}

Assistant:

void smult(double* A, double* B, double* C,int m,int n, int p) {
	int a,b,c,nrec;
	double *X,*Y,*Z,*P;
	a = m;
	b = n;
	c = p;
	nrec = findrec(&a,&b,&c);
	X = (double*) malloc(sizeof(double) * a * b);
	Y = (double*) malloc(sizeof(double) * b * c);
	Z = (double*) malloc(sizeof(double) * a * c);
	P = (double*) malloc(sizeof(double) * (a/2) * (c/2));

	
	add_zero_pad(A,m,n,a-m,b-n,X);
	add_zero_pad(B,n,p,b-n,c-p,Y);

	srecmult(X,Y,Z,a,b,c,b,c,c);
	// Memory allocation needs work
	
	remove_zero_pad(Z,a,c,a-m,c-p,C);
	
	// free X,Y,Z
	free(X);
	free(Y);
	free(Z);
	free(P);
	
}